

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseKernel.hh
# Opt level: O2

reference __thiscall
OpenMesh::BaseKernel::property<OpenMesh::Attributes::StatusInfo>
          (BaseKernel *this,HPropHandleT<OpenMesh::Attributes::StatusInfo> _ph,HalfedgeHandle _hh)

{
  PropertyT<OpenMesh::Attributes::StatusInfo> *this_00;
  reference pvVar1;
  
  this_00 = PropertyContainer::property<OpenMesh::Attributes::StatusInfo>
                      (&this->hprops_,
                       _ph.super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.
                       idx_);
  pvVar1 = PropertyT<OpenMesh::Attributes::StatusInfo>::operator[]
                     (this_00,(int)_hh.super_BaseHandle.idx_);
  return pvVar1;
}

Assistant:

typename HPropHandleT<T>::reference
  property(HPropHandleT<T> _ph, HalfedgeHandle _hh) {
    return hprops_.property(_ph)[_hh.idx()];
  }